

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::TableImport::TableImport(TableImport *this,string_view name)

{
  string_view local_28;
  
  local_28.size_ = name.size_;
  local_28.data_ = name.data_;
  (this->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.module_name._M_dataplus._M_p =
       (pointer)&(this->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.module_name.field_2;
  (this->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.module_name._M_string_length = 0;
  (this->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.module_name.field_2._M_local_buf[0]
       = '\0';
  (this->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.field_name._M_dataplus._M_p =
       (pointer)&(this->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.field_name.field_2;
  (this->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.field_name._M_string_length = 0;
  (this->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.field_name.field_2._M_local_buf[0] =
       '\0';
  (this->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.kind_ = Table;
  (this->super_ImportMixin<(wabt::ExternalKind)1>).super_Import._vptr_Import =
       (_func_int **)&PTR__TableImport_01544608;
  string_view::to_string_abi_cxx11_(&(this->table).name,&local_28);
  (this->table).elem_limits.initial = 0;
  (this->table).elem_limits.max = 0;
  (this->table).elem_limits.has_max = false;
  (this->table).elem_limits.is_shared = false;
  return;
}

Assistant:

explicit TableImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Table>(), table(name) {}